

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * identifiderExp(void)

{
  treeNode *ptVar1;
  bool bVar2;
  treeNode *ptVar3;
  bool local_15a;
  bool local_132;
  treeNode *tmp;
  string local_110;
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_99;
  string local_98;
  byte local_73;
  byte local_72;
  allocator local_71;
  string local_70;
  allocator local_49;
  string local_48;
  treeNode *local_18;
  treeNode *ret;
  
  ptVar3 = (treeNode *)operator_new(0x58);
  treeNode::treeNode(ptVar3,expression);
  local_18 = ptVar3;
  std::allocator<char>::allocator();
  local_72 = 0;
  local_73 = 0;
  std::__cxx11::string::string((string *)&local_48,"++",&local_49);
  bVar2 = match(&local_48,Empty);
  local_132 = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string((string *)&local_70,"--",&local_71);
    local_73 = 1;
    local_132 = match(&local_70,Empty);
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (local_132 != false) {
    ptVar3 = (treeNode *)operator_new(0x58);
    local_99 = 1;
    std::__cxx11::string::string((string *)&local_98,(string *)&preToken.text);
    treeNode::treeNode(ptVar3,opExp,&local_98);
    local_99 = 0;
    local_18->child[0] = ptVar3;
    std::__cxx11::string::~string((string *)&local_98);
  }
  ptVar3 = identifider();
  local_18->child[1] = ptVar3;
  std::allocator<char>::allocator();
  local_ea = 0;
  local_eb = 0;
  std::__cxx11::string::string((string *)&local_c0,"++",&local_c1);
  bVar2 = match(&local_c0,Empty);
  local_15a = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string((string *)&local_e8,"--",&local_e9);
    local_eb = 1;
    local_15a = match(&local_e8,Empty);
  }
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  if (local_15a != false) {
    ptVar3 = (treeNode *)operator_new(0x58);
    std::__cxx11::string::string((string *)&local_110,(string *)&preToken.text);
    treeNode::treeNode(ptVar3,opExp,&local_110);
    local_18->child[2] = ptVar3;
    std::__cxx11::string::~string((string *)&local_110);
  }
  ptVar3 = local_18;
  if ((local_18->child[0] == (treeNode *)0x0) && (local_18->child[2] == (treeNode *)0x0)) {
    ptVar1 = local_18->child[1];
    ret = ptVar1;
    if (local_18 != (treeNode *)0x0) {
      treeNode::~treeNode(local_18);
      operator_delete(ptVar3);
    }
  }
  else {
    ret = local_18;
  }
  return ret;
}

Assistant:

treeNode* identifiderExp()
{
    treeNode* ret=new treeNode(NodeKind::expression);
    if(match("++")||match("--"))
    {
        ret->child[0]=new treeNode(ExpKind::opExp,preToken.text);
    }
    ret->child[1]=identifider();
    if(match("++")||match("--"))
    {
        ret->child[2]=new treeNode(ExpKind::opExp,preToken.text);
    }

    if(ret->child[0]==nullptr&&ret->child[2]==nullptr)
    {
        auto tmp = ret->child[1];
        delete ret;
        return tmp;
    }
    else
        return ret;
}